

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::VariableP<tcu::Matrix<float,_3,_3>_>::VariableP
          (VariableP<tcu::Matrix<float,_3,_3>_> *this,Variable<tcu::Matrix<float,_3,_3>_> *ptr)

{
  SharedPtrStateBase *pSVar1;
  
  (this->super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_3>_>_>).m_state =
       (SharedPtrStateBase *)0x0;
  (this->super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_3>_>_>).m_ptr =
       ptr;
  pSVar1 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar1->strongRefCount = 0;
  pSVar1->weakRefCount = 0;
  pSVar1->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d0db70;
  pSVar1[1]._vptr_SharedPtrStateBase = (_func_int **)ptr;
  (this->super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_3>_>_>).m_state =
       pSVar1;
  pSVar1->strongRefCount = 1;
  pSVar1->weakRefCount = 1;
  return;
}

Assistant:

explicit	VariableP	(const Variable<T>* ptr) : Super(ptr) {}